

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorShader::GenerateElementData(DecoratorShader *this,Element *element,BoxArea paint_area)

{
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  *this_00;
  Vector2f rhs;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  bool bVar1;
  RenderManager *mesh_00;
  ComputedValues *this_01;
  Pool<Rml::ShaderElementData> *this_02;
  float fVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_2a0;
  undefined1 local_268 [24];
  ShaderElementData *element_data;
  Vector2f local_248;
  Vector2<float> local_240;
  Vector2<float> local_238;
  reference local_230;
  Vertex *vertex;
  iterator __end1;
  iterator __begin1;
  Vector<Vertex> *__range1;
  Vector2f offset;
  byte alpha;
  ComputedValues *computed;
  Mesh mesh;
  Variant local_1c0;
  Variant local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_170;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_120;
  iterator local_d8;
  size_type local_d0;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_c8;
  allocator<char> local_99;
  Dictionary local_98;
  undefined1 local_78 [8];
  CompiledShader shader;
  Vector2f dimensions;
  RenderBox render_box;
  RenderManager *render_manager;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorShader *this_local;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    this_local = (DecoratorShader *)0x0;
  }
  else {
    Element::GetRenderBox((RenderBox *)&dimensions,element,paint_area,0);
    shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle =
         (unsigned_long)RenderBox::GetFillSize((RenderBox *)&dimensions);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"shader",&local_99);
    mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    local_170 = &local_168;
    Variant::Variant<std::__cxx11::string_const&,void>(&local_198,&this->value);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_168,(char (*) [6])0x70c2fa,&local_198);
    local_170 = &local_120;
    Variant::Variant<Rml::Vector2<float>const&,void>
              (&local_1c0,
               (Vector2<float> *)
               &shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                resource_handle);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[11],_Rml::Variant,_true>
              (&local_120,(char (*) [11])"dimensions",&local_1c0);
    mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    local_d8 = &local_168;
    local_d0 = 2;
    this_00 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
               *)((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5);
    ::std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
    ::allocator(this_00);
    init._M_len = local_d0;
    init._M_array = local_d8;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map(&local_c8,init,
               (key_compare *)
               ((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6),this_00);
    RenderManager::CompileShader((RenderManager *)local_78,(String *)mesh_00,&local_98);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::~flat_map(&local_c8);
    ::std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
                  *)((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 5));
    local_2a0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                 *)&local_d8;
    do {
      local_2a0 = local_2a0 + -1;
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
      ::~pair(local_2a0);
    } while (local_2a0 != &local_168);
    Variant::~Variant(&local_1c0);
    Variant::~Variant(&local_198);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::allocator<char>::~allocator(&local_99);
    bVar1 = UniqueRenderResource::operator_cast_to_bool((UniqueRenderResource *)local_78);
    if (bVar1) {
      Mesh::Mesh((Mesh *)&computed);
      this_01 = Element::GetComputedValues(element);
      fVar2 = Style::ComputedValues::opacity(this_01);
      offset.y._3_1_ = (uchar)(int)(fVar2 * 255.0);
      Colour<unsigned_char,_255,_true>::Colour
                ((Colour<unsigned_char,_255,_true> *)((long)&offset.x + 3),offset.y._3_1_,
                 offset.y._3_1_);
      MeshUtilities::GenerateBackground
                ((Mesh *)&computed,(RenderBox *)&dimensions,(ColourbPremultiplied)offset._3_4_);
      rhs = RenderBox::GetFillOffset((RenderBox *)&dimensions);
      __end1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::begin
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&computed);
      vertex = (Vertex *)
               ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::end
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&computed);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                                    *)&vertex);
        if (!bVar1) break;
        local_230 = __gnu_cxx::
                    __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                    ::operator*(&__end1);
        local_248 = rhs;
        local_240 = Vector2<float>::operator-(&local_230->position,rhs);
        element_data = (ShaderElementData *)
                       shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                       resource_handle;
        local_238 = Vector2<float>::operator/
                              (&local_240,
                               (Vector2<float>)
                               shader.
                               super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                               resource_handle);
        (local_230->tex_coord).x = local_238.x;
        (local_230->tex_coord).y = local_238.y;
        __gnu_cxx::
        __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>::
        operator++(&__end1);
      }
      this_02 = GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_268,(Mesh *)mesh_00);
      this_local = (DecoratorShader *)
                   Pool<Rml::ShaderElementData>::
                   AllocateAndConstruct<Rml::Geometry,Rml::CompiledShader>
                             (this_02,(Geometry *)local_268,(CompiledShader *)local_78);
      Geometry::~Geometry((Geometry *)local_268);
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      local_268._16_8_ = this_local;
      Mesh::~Mesh((Mesh *)&computed);
    }
    else {
      this_local = (DecoratorShader *)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    CompiledShader::~CompiledShader((CompiledShader *)local_78);
  }
  return (DecoratorDataHandle)this_local;
}

Assistant:

DecoratorDataHandle DecoratorShader::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();
	CompiledShader shader = render_manager->CompileShader("shader", Dictionary{{"value", Variant(value)}, {"dimensions", Variant(dimensions)}});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;

	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = (vertex.position - offset) / dimensions;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));

	return reinterpret_cast<DecoratorDataHandle>(element_data);
}